

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuLaunchFunctsC.H
# Opt level: O0

void amrex::
     ParallelFor<amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__3>
               (Box *box,anon_class_152_8_6ab5d93c *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *in_RDI;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int in_stack_fffffffffffffef8;
  int i_00;
  int iVar7;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[3];
  iVar4 = in_RDI[4];
  iVar5 = in_RDI[5];
  for (iVar6 = in_RDI[2]; iVar7 = iVar2, iVar6 <= iVar5; iVar6 = iVar6 + 1) {
    for (; i_00 = iVar1, iVar7 <= iVar4; iVar7 = iVar7 + 1) {
      for (; i_00 <= iVar3; i_00 = i_00 + 1) {
        detail::
        call_f<amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__3>
                  ((anon_class_152_8_6ab5d93c *)CONCAT44(iVar6,iVar7),i_00,in_stack_fffffffffffffef8
                   ,0);
      }
    }
  }
  return;
}

Assistant:

void ParallelFor (Box const& box, L&& f) noexcept
{
    const auto lo = amrex::lbound(box);
    const auto hi = amrex::ubound(box);
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        detail::call_f(f,i,j,k);
    }}}
}